

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v10::detail::fwrite_fully(void *ptr,size_t size,size_t count,FILE *stream)

{
  format_string<> fmt;
  size_t sVar1;
  undefined8 uVar2;
  FILE *in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  void *in_RDI;
  size_t written;
  anon_class_1_0_00000001 local_4a [2];
  basic_string_view<char> local_48;
  int error_code;
  
  sVar1 = fwrite(in_RDI,in_RSI,in_RDX,in_RCX);
  if (sVar1 < in_RDX) {
    uVar2 = __cxa_allocate_exception(0x20);
    error_code = (int)(sVar1 >> 0x20);
    __errno_location();
    fwrite_fully::anon_class_1_0_00000001::operator()(local_4a);
    local_48 = v10::operator()((FMT_COMPILE_STRING *)0x362adc);
    check_format_string<FMT_COMPILE_STRING,_0>();
    fmt.str_.size_ = in_RDX;
    fmt.str_.data_ = (char *)in_RCX;
    system_error<>(error_code,fmt);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

inline void fwrite_fully(const void* ptr, size_t size, size_t count,
                         FILE* stream) {
  size_t written = std::fwrite(ptr, size, count, stream);
  if (written < count)
    FMT_THROW(system_error(errno, FMT_STRING("cannot write to file")));
}